

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O2

void __thiscall timer_group_context::onTaskAdded(timer_group_context *this,task_handle *hTask)

{
  uint64_t guid;
  timing_registry *this_00;
  task_group_base *ptVar1;
  __shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = timing_registry::get();
  ptVar1 = oqpi::group_context_base::owner(&this->super_group_context_base);
  guid = (ptVar1->super_task_base).uid_;
  std::__shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,(__shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2> *)hTask);
  timing_registry::addToGroup(this_00,guid,(task_handle *)&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return;
}

Assistant:

inline void onTaskAdded(const oqpi::task_handle &hTask)
    {
        timing_registry::get().addToGroup(this->owner()->getUID(), hTask);
    }